

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O1

void jsoncons::detail::fill_exponent<jsoncons::stream_sink<char>>(int K,stream_sink<char> *result)

{
  byte bVar1;
  uint value;
  ulong uVar2;
  byte bVar3;
  
  uVar2 = (ulong)(uint)K;
  if (K < 0) {
    stream_sink<char>::push_back(result,'-');
    uVar2 = (ulong)(uint)-K;
  }
  else {
    stream_sink<char>::push_back(result,'+');
  }
  value = (uint)uVar2;
  if ((int)value < 10) {
    stream_sink<char>::push_back(result,'0');
    bVar1 = (char)uVar2 + 0x30;
  }
  else {
    if ((int)value < 100) {
      bVar3 = (byte)(uVar2 / 10);
      bVar1 = (char)(uVar2 / 10) + 0x30;
    }
    else {
      if (999 < (int)value) {
        from_integer<int,jsoncons::stream_sink<char>>(value,result);
        return;
      }
      stream_sink<char>::push_back(result,(char)(uVar2 / 100) + '0');
      value = value + (int)(uVar2 / 100) * -100;
      bVar3 = (byte)((ulong)value * 0x1999999a >> 0x20);
      bVar1 = bVar3 | 0x30;
    }
    stream_sink<char>::push_back(result,bVar1);
    bVar1 = (char)value + bVar3 * -10 | 0x30;
  }
  stream_sink<char>::push_back(result,bVar1);
  return;
}

Assistant:

void fill_exponent(int K, Result& result)
    {
        if (K < 0)
        {
            result.push_back('-');
            K = -K;
        }
        else
        {
            result.push_back('+'); // compatibility with sprintf
        }

        if (K < 10)
        {
            result.push_back('0'); // compatibility with sprintf
            result.push_back((char)('0' + K));
        }
        else if (K < 100)
        {
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else if (K < 1000)
        {
            result.push_back((char)('0' + K / 100)); K %= 100;
            result.push_back((char)('0' + K / 10)); K %= 10;
            result.push_back((char)('0' + K));
        }
        else
        {
            jsoncons::detail::from_integer(K, result);
        }
    }